

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

void __thiscall
PSVIWriterHandlers::processElementDeclarationRef
          (PSVIWriterHandlers *this,XMLCh *enclose,XSElementDeclaration *elemDecl)

{
  XSElementDeclaration *elemDecl_local;
  XMLCh *enclose_local;
  PSVIWriterHandlers *this_local;
  
  if (elemDecl == (XSElementDeclaration *)0x0) {
    sendElementEmpty(this,enclose);
  }
  else {
    sendIndentedElement(this,enclose);
    sendReference(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgElementDeclaration,(XSObject *)elemDecl);
    sendUnindentedElement(this,enclose);
  }
  return;
}

Assistant:

void PSVIWriterHandlers::processElementDeclarationRef(const XMLCh* enclose, XSElementDeclaration* elemDecl) {
	if (elemDecl==NULL) {
		sendElementEmpty(enclose);
	} else {
		sendIndentedElement(enclose);
		sendReference(PSVIUni::fgElementDeclaration, elemDecl);
		sendUnindentedElement(enclose);
	}
}